

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

unsigned_long xmlChildElementCount(xmlNodePtr parent)

{
  xmlElementType xVar1;
  _xmlNode *local_28;
  xmlNodePtr cur;
  unsigned_long ret;
  xmlNodePtr parent_local;
  
  cur = (xmlNodePtr)0x0;
  if (parent == (xmlNodePtr)0x0) {
    parent_local = (xmlNodePtr)0x0;
  }
  else {
    xVar1 = parent->type;
    if ((((xVar1 == XML_ELEMENT_NODE) || (xVar1 == XML_ENTITY_NODE)) || (xVar1 == XML_DOCUMENT_NODE)
        ) || ((xVar1 == XML_DOCUMENT_FRAG_NODE || (xVar1 == XML_HTML_DOCUMENT_NODE)))) {
      for (local_28 = parent->children; local_28 != (_xmlNode *)0x0; local_28 = local_28->next) {
        if (local_28->type == XML_ELEMENT_NODE) {
          cur = (xmlNodePtr)((long)&cur->_private + 1);
        }
      }
      parent_local = cur;
    }
    else {
      parent_local = (xmlNodePtr)0x0;
    }
  }
  return (unsigned_long)parent_local;
}

Assistant:

unsigned long
xmlChildElementCount(xmlNodePtr parent) {
    unsigned long ret = 0;
    xmlNodePtr cur = NULL;

    if (parent == NULL)
        return(0);
    switch (parent->type) {
        case XML_ELEMENT_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_HTML_DOCUMENT_NODE:
            cur = parent->children;
            break;
        default:
            return(0);
    }
    while (cur != NULL) {
        if (cur->type == XML_ELEMENT_NODE)
            ret++;
        cur = cur->next;
    }
    return(ret);
}